

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

void __thiscall
duckdb::QueryResult::QueryResult(QueryResult *this,QueryResultType type,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator local_b9;
  char *local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  ErrorData local_98;
  
  ErrorData::ErrorData(&local_98,error);
  BaseQueryResult::BaseQueryResult(&this->super_BaseQueryResult,type,&local_98);
  ErrorData::~ErrorData(&local_98);
  (this->super_BaseQueryResult)._vptr_BaseQueryResult = (_func_int **)&PTR__QueryResult_027bd110;
  ::std::__cxx11::string::string((string *)&local_b8,"UTC",&local_b9);
  paVar1 = &(this->client_properties).time_zone.field_2;
  (this->client_properties).time_zone._M_dataplus._M_p = (pointer)paVar1;
  if (local_b8 == &local_a8) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
    *(undefined8 *)((long)&(this->client_properties).time_zone.field_2 + 8) = uStack_a0;
  }
  else {
    (this->client_properties).time_zone._M_dataplus._M_p = local_b8;
    (this->client_properties).time_zone.field_2._M_allocated_capacity = CONCAT71(uStack_a7,local_a8)
    ;
  }
  (this->client_properties).time_zone._M_string_length = local_b0;
  local_b0 = 0;
  local_a8 = '\0';
  (this->client_properties).client_context.ptr = (ClientContext *)0x0;
  (this->client_properties).arrow_offset_size = REGULAR;
  (this->client_properties).arrow_use_list_view = false;
  (this->client_properties).produce_arrow_string_view = false;
  (this->client_properties).arrow_lossless_conversion = false;
  local_b8 = &local_a8;
  ::std::__cxx11::string::~string((string *)&local_b8);
  (this->next).super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t
  .super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
  return;
}

Assistant:

QueryResult::QueryResult(QueryResultType type, ErrorData error)
    : BaseQueryResult(type, std::move(error)),
      client_properties("UTC", ArrowOffsetSize::REGULAR, false, false, false, nullptr) {
}